

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

uint64_t read_address(dwarf_buf *buf,int addrsize)

{
  byte bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  int addrsize_local;
  dwarf_buf *buf_local;
  
  switch(addrsize) {
  case 1:
    bVar1 = read_byte(buf);
    buf_local = (dwarf_buf *)(ulong)bVar1;
    break;
  case 2:
    uVar2 = read_uint16(buf);
    buf_local = (dwarf_buf *)(ulong)uVar2;
    break;
  default:
    dwarf_buf_error(buf,"unrecognized address size",0);
    buf_local = (dwarf_buf *)0x0;
    break;
  case 4:
    uVar3 = read_uint32(buf);
    buf_local = (dwarf_buf *)(ulong)uVar3;
    break;
  case 8:
    buf_local = (dwarf_buf *)read_uint64(buf);
  }
  return (uint64_t)buf_local;
}

Assistant:

static uint64_t
read_address (struct dwarf_buf *buf, int addrsize)
{
  switch (addrsize)
    {
    case 1:
      return read_byte (buf);
    case 2:
      return read_uint16 (buf);
    case 4:
      return read_uint32 (buf);
    case 8:
      return read_uint64 (buf);
    default:
      dwarf_buf_error (buf, "unrecognized address size", 0);
      return 0;
    }
}